

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O0

void __thiscall TinyProcessLib::Process::close_stdin(Process *this)

{
  bool bVar1;
  type piVar2;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Process *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->stdin_mutex);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
  if (bVar1) {
    if (0 < (this->data).id) {
      piVar2 = std::unique_ptr<int,_std::default_delete<int>_>::operator*(&this->stdin_fd);
      close(*piVar2);
    }
    std::unique_ptr<int,_std::default_delete<int>_>::reset(&this->stdin_fd,(pointer)0x0);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void Process::close_stdin() noexcept {
  std::lock_guard<std::mutex> lock(stdin_mutex);
  if(stdin_fd) {
    if(data.id > 0)
      close(*stdin_fd);
    stdin_fd.reset();
  }
}